

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_font * nk_font_atlas_add_compressed_base85
                    (nk_font_atlas *atlas,char *data_base85,float height,nk_font_config *config)

{
  int iVar1;
  uchar *dst;
  nk_font *font;
  void *compressed_data;
  int compressed_size;
  nk_font_config *config_local;
  float height_local;
  char *data_base85_local;
  nk_font_atlas *atlas_local;
  
  if (atlas == (nk_font_atlas *)0x0) {
    __assert_fail("atlas",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x356b,
                  "struct nk_font *nk_font_atlas_add_compressed_base85(struct nk_font_atlas *, const char *, float, const struct nk_font_config *)"
                 );
  }
  if ((atlas->temporary).alloc == (nk_plugin_alloc)0x0) {
    __assert_fail("atlas->temporary.alloc",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x356c,
                  "struct nk_font *nk_font_atlas_add_compressed_base85(struct nk_font_atlas *, const char *, float, const struct nk_font_config *)"
                 );
  }
  if ((atlas->temporary).free == (nk_plugin_free)0x0) {
    __assert_fail("atlas->temporary.free",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x356d,
                  "struct nk_font *nk_font_atlas_add_compressed_base85(struct nk_font_atlas *, const char *, float, const struct nk_font_config *)"
                 );
  }
  if ((atlas->permanent).alloc != (nk_plugin_alloc)0x0) {
    if ((atlas->permanent).free == (nk_plugin_free)0x0) {
      __assert_fail("atlas->permanent.free",
                    "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                    ,0x356f,
                    "struct nk_font *nk_font_atlas_add_compressed_base85(struct nk_font_atlas *, const char *, float, const struct nk_font_config *)"
                   );
    }
    if (data_base85 != (char *)0x0) {
      if ((((atlas == (nk_font_atlas *)0x0) || (data_base85 == (char *)0x0)) ||
          ((atlas->temporary).alloc == (nk_plugin_alloc)0x0)) ||
         ((((atlas->temporary).free == (nk_plugin_free)0x0 ||
           ((atlas->permanent).alloc == (nk_plugin_alloc)0x0)) ||
          ((atlas->permanent).free == (nk_plugin_free)0x0)))) {
        atlas_local = (nk_font_atlas *)0x0;
      }
      else {
        iVar1 = nk_strlen(data_base85);
        iVar1 = (iVar1 + 4) / 5 << 2;
        dst = (uchar *)(*(atlas->temporary).alloc)
                                 ((atlas->temporary).userdata,(void *)0x0,(long)iVar1);
        if (dst == (uchar *)0x0) {
          __assert_fail("compressed_data",
                        "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                        ,0x3578,
                        "struct nk_font *nk_font_atlas_add_compressed_base85(struct nk_font_atlas *, const char *, float, const struct nk_font_config *)"
                       );
        }
        if (dst == (uchar *)0x0) {
          atlas_local = (nk_font_atlas *)0x0;
        }
        else {
          nk_decode_85(dst,(uchar *)data_base85);
          atlas_local = (nk_font_atlas *)
                        nk_font_atlas_add_compressed(atlas,dst,(long)iVar1,height,config);
          (*(atlas->temporary).free)((atlas->temporary).userdata,dst);
        }
      }
      return (nk_font *)atlas_local;
    }
    __assert_fail("data_base85",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x3571,
                  "struct nk_font *nk_font_atlas_add_compressed_base85(struct nk_font_atlas *, const char *, float, const struct nk_font_config *)"
                 );
  }
  __assert_fail("atlas->permanent.alloc",
                "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h",
                0x356e,
                "struct nk_font *nk_font_atlas_add_compressed_base85(struct nk_font_atlas *, const char *, float, const struct nk_font_config *)"
               );
}

Assistant:

NK_API struct nk_font*
nk_font_atlas_add_compressed_base85(struct nk_font_atlas *atlas,
    const char *data_base85, float height, const struct nk_font_config *config)
{
    int compressed_size;
    void *compressed_data;
    struct nk_font *font;

    NK_ASSERT(atlas);
    NK_ASSERT(atlas->temporary.alloc);
    NK_ASSERT(atlas->temporary.free);
    NK_ASSERT(atlas->permanent.alloc);
    NK_ASSERT(atlas->permanent.free);

    NK_ASSERT(data_base85);
    if (!atlas || !data_base85 || !atlas->temporary.alloc || !atlas->temporary.free ||
        !atlas->permanent.alloc || !atlas->permanent.free)
        return 0;

    compressed_size = (((int)nk_strlen(data_base85) + 4) / 5) * 4;
    compressed_data = atlas->temporary.alloc(atlas->temporary.userdata,0, (nk_size)compressed_size);
    NK_ASSERT(compressed_data);
    if (!compressed_data) return 0;
    nk_decode_85((unsigned char*)compressed_data, (const unsigned char*)data_base85);
    font = nk_font_atlas_add_compressed(atlas, compressed_data,
                    (nk_size)compressed_size, height, config);
    atlas->temporary.free(atlas->temporary.userdata, compressed_data);
    return font;
}